

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void op_extract_jpeg_params
               (uchar *_buf,size_t _buf_sz,opus_uint32 *_width,opus_uint32 *_height,
               opus_uint32 *_depth,opus_uint32 *_colors,int *_has_palette)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  
  if ((_buf_sz < 3) || (_buf[2] != 0xff || *(short *)_buf != -0x2701)) {
    return;
  }
  uVar3 = 2;
  do {
    uVar4 = uVar3;
    if (uVar3 < _buf_sz) {
      do {
        uVar4 = uVar3;
        if (_buf[uVar3] == 0xff) break;
        uVar3 = uVar3 + 1;
        uVar4 = _buf_sz;
      } while (_buf_sz != uVar3);
    }
    uVar5 = uVar4;
    if (uVar4 < _buf_sz) {
      do {
        uVar5 = uVar4;
        if (_buf[uVar4] != 0xff) break;
        uVar4 = uVar4 + 1;
        uVar5 = _buf_sz;
      } while (_buf_sz != uVar4);
    }
    bVar1 = _buf[uVar5];
    uVar3 = uVar5 + 1;
    bVar2 = true;
    if (2 < (byte)(bVar1 + 0x28) && uVar3 < _buf_sz) {
      if ((bVar1 & 0xf8) == 0xd0) {
LAB_0010ab62:
        bVar2 = false;
      }
      else if (((1 < _buf_sz - uVar3) &&
               (uVar6 = *(ushort *)(_buf + uVar5 + 1) << 8 | *(ushort *)(_buf + uVar5 + 1) >> 8,
               1 < uVar6)) && ((ulong)uVar6 <= _buf_sz - uVar3)) {
        if ((bVar1 != 0xc0) && ((bVar1 & 3) == 0 || (byte)(bVar1 + 0x30) < 0xf1)) {
          uVar3 = uVar3 + uVar6;
          goto LAB_0010ab62;
        }
        if (7 < uVar6) {
          *_height = (uint)(ushort)(*(ushort *)(_buf + uVar5 + 4) << 8 |
                                   *(ushort *)(_buf + uVar5 + 4) >> 8);
          *_width = (uint)(ushort)(*(ushort *)(_buf + uVar5 + 6) << 8 |
                                  *(ushort *)(_buf + uVar5 + 6) >> 8);
          *_depth = (uint)_buf[uVar5 + 8] * (uint)_buf[uVar5 + 3];
          *_colors = 0;
          *_has_palette = 0;
        }
      }
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void op_extract_jpeg_params(const unsigned char *_buf,size_t _buf_sz,
 opus_uint32 *_width,opus_uint32 *_height,
 opus_uint32 *_depth,opus_uint32 *_colors,int *_has_palette){
  if(op_is_jpeg(_buf,_buf_sz)){
    size_t offs;
    offs=2;
    for(;;){
      size_t segment_len;
      int    marker;
      while(offs<_buf_sz&&_buf[offs]!=0xFF)offs++;
      while(offs<_buf_sz&&_buf[offs]==0xFF)offs++;
      marker=_buf[offs];
      offs++;
      /*If we hit EOI* (end of image), or another SOI* (start of image),
         or SOS (start of scan), then stop now.*/
      if(offs>=_buf_sz||(marker>=0xD8&&marker<=0xDA))break;
      /*RST* (restart markers): skip (no segment length).*/
      else if(marker>=0xD0&&marker<=0xD7)continue;
      /*Read the length of the marker segment.*/
      if(_buf_sz-offs<2)break;
      segment_len=_buf[offs]<<8|_buf[offs+1];
      if(segment_len<2||_buf_sz-offs<segment_len)break;
      if(marker==0xC0||(marker>0xC0&&marker<0xD0&&(marker&3)!=0)){
        /*Found a SOFn (start of frame) marker segment:*/
        if(segment_len>=8){
          *_height=_buf[offs+3]<<8|_buf[offs+4];
          *_width=_buf[offs+5]<<8|_buf[offs+6];
          *_depth=_buf[offs+2]*_buf[offs+7];
          *_colors=0;
          *_has_palette=0;
        }
        break;
      }
      /*Other markers: skip the whole marker segment.*/
      offs+=segment_len;
    }
  }
}